

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::removeMember(Value *this,char *begin,char *end,Value *removed)

{
  bool bVar1;
  ValueType VVar2;
  pointer ppVar3;
  _Self local_60 [3];
  _Self local_48;
  iterator it;
  CZString actualKey;
  Value *removed_local;
  char *end_local;
  char *begin_local;
  Value *this_local;
  
  VVar2 = type(this);
  if (VVar2 == objectValue) {
    removed_local._0_4_ = (int)end;
    CZString::CZString((CZString *)&it,begin,(int)removed_local - (int)begin,noDuplication);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    bVar1 = std::operator==(&local_48,local_60);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      if (removed != (Value *)0x0) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
                 operator->(&local_48);
        operator=(removed,&ppVar3->second);
      }
      std::
      map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                          *)(this->value_).map_,(iterator)local_48._M_node);
      this_local._7_1_ = true;
    }
    CZString::~CZString((CZString *)&it);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::removeMember(const char* begin, const char* end, Value* removed) {
  if (type() != objectValue) {
    return false;
  }
  CZString actualKey(begin, static_cast<unsigned>(end - begin),
                     CZString::noDuplication);
  auto it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return false;
  if (removed)
    *removed = std::move(it->second);
  value_.map_->erase(it);
  return true;
}